

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O2

ALLEGRO_SHADER * al_create_shader(ALLEGRO_SHADER_PLATFORM platform)

{
  _Bool _Var1;
  ALLEGRO_SHADER_PLATFORM AVar2;
  ALLEGRO_SHADER *object;
  _AL_LIST_ITEM *p_Var3;
  
  AVar2 = resolve_platform(platform);
  if ((AVar2 == ALLEGRO_SHADER_GLSL) &&
     (object = _al_create_shader_glsl(ALLEGRO_SHADER_GLSL), object != (ALLEGRO_SHADER *)0x0)) {
    p_Var3 = _al_register_destructor(_al_dtor_list,"shader",object,al_destroy_shader);
    object->dtor_item = p_Var3;
    return object;
  }
  _Var1 = _al_trace_prefix("shader",2,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/shader.c"
                           ,0x4c,"al_create_shader");
  if (_Var1) {
    _al_trace_suffix("Failed to create shader\n");
  }
  return (ALLEGRO_SHADER *)0x0;
}

Assistant:

ALLEGRO_SHADER *al_create_shader(ALLEGRO_SHADER_PLATFORM platform)
{
   ALLEGRO_SHADER *shader = NULL;

   platform = resolve_platform(platform);

   if (false) {
   }
#ifdef ALLEGRO_CFG_SHADER_GLSL
   else if (platform == ALLEGRO_SHADER_GLSL) {
      shader = _al_create_shader_glsl(platform);
   }
#endif
#ifdef ALLEGRO_CFG_SHADER_HLSL
   else if (platform == ALLEGRO_SHADER_HLSL) {
      shader = _al_create_shader_hlsl(platform);
   }
#endif

   if (shader) {
      ASSERT(shader->platform);
      ASSERT(shader->vt);
      shader->dtor_item = _al_register_destructor(_al_dtor_list, "shader", shader,
         (void (*)(void *))al_destroy_shader);
   }
   else {
      ALLEGRO_WARN("Failed to create shader\n");
   }
   return shader;
}